

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O3

void tlb_flush_by_mmuidx_async_work(CPUState *cpu,run_on_cpu_data data)

{
  CPUArchState_conflict30 *env;
  int mmu_idx;
  ushort uVar1;
  uint uVar2;
  short sVar3;
  uint uVar4;
  timeval tv;
  timeval local_40;
  
  env = (CPUArchState_conflict30 *)cpu->env_ptr;
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  uVar4 = env[-3].gpr_a[0] & data.host_int;
  *(ushort *)env[-3].gpr_a = (ushort)env[-3].gpr_a[0] & (ushort)~uVar4;
  sVar3 = (short)uVar4;
  if (sVar3 == 0) {
    memset(cpu->tb_jmp_cache,0,0x8000);
  }
  else {
    uVar2 = uVar4;
    do {
      mmu_idx = 0;
      if (uVar2 != 0) {
        for (; (uVar2 >> mmu_idx & 1) == 0; mmu_idx = mmu_idx + 1) {
        }
      }
      tlb_flush_one_mmuidx_locked
                (env,mmu_idx,local_40.tv_usec * 1000 + local_40.tv_sec * 1000000000);
      uVar1 = (ushort)(uVar2 - 1) & (ushort)uVar2;
      uVar2 = CONCAT22((short)(uVar2 - 1 >> 0x10),uVar1);
    } while (uVar1 != 0);
    memset(cpu->tb_jmp_cache,0,0x8000);
    if (sVar3 == 7) {
      *(long *)(env[-3].gpr_a + 2) = *(long *)(env[-3].gpr_a + 2) + 1;
      return;
    }
  }
  uVar2 = uVar4 - (uVar4 >> 1 & 0x5555);
  uVar2 = (uVar2 >> 2 & 0x3333) + (uVar2 & 0x3333);
  uVar2 = (uVar2 >> 4) + uVar2 & 0xf0f;
  *(ulong *)(env[-3].gpr_a + 4) =
       *(long *)(env[-3].gpr_a + 4) + (ulong)((uVar2 >> 8) + uVar2 & 0xff);
  if (sVar3 != (short)data.host_ulong) {
    uVar4 = ~uVar4 & data.host_int;
    uVar4 = uVar4 - (uVar4 >> 1 & 0x5555);
    uVar4 = (uVar4 >> 2 & 0x3333) + (uVar4 & 0x3333);
    uVar4 = (uVar4 >> 4) + uVar4 & 0xf0f;
    *(ulong *)(env[-3].gpr_a + 6) =
         *(long *)(env[-3].gpr_a + 6) + (ulong)((uVar4 >> 8) + uVar4 & 0xff);
  }
  return;
}

Assistant:

static void tlb_flush_by_mmuidx_async_work(CPUState *cpu, run_on_cpu_data data)
{
    CPUArchState *env = cpu->env_ptr;
    uint16_t asked = data.host_int;
    uint16_t all_dirty, work, to_clean;
    int64_t now = get_clock_realtime();

    all_dirty = env_tlb(env)->c.dirty;
    to_clean = asked & all_dirty;
    all_dirty &= ~to_clean;
    env_tlb(env)->c.dirty = all_dirty;

    for (work = to_clean; work != 0; work &= work - 1) {
        int mmu_idx = ctz32(work);
        tlb_flush_one_mmuidx_locked(env, mmu_idx, now);
    }

    cpu_tb_jmp_cache_clear(cpu);

    if (to_clean == ALL_MMUIDX_BITS) {
        env_tlb(env)->c.full_flush_count = env_tlb(env)->c.full_flush_count + 1;
    } else {
        env_tlb(env)->c.part_flush_count = env_tlb(env)->c.part_flush_count + ctpop16(to_clean);
        if (to_clean != asked) {
            env_tlb(env)->c.elide_flush_count = env_tlb(env)->c.elide_flush_count + ctpop16(asked & ~to_clean);
        }
    }
}